

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sz_compat.c
# Opt level: O3

int SZ_BufftoBuffCompress(void *dest,size_t *destLen,void *source,size_t sourceLen,SZ_com_t *param)

{
  uint uVar1;
  uint *puVar2;
  int i;
  uint uVar3;
  uint uVar4;
  void *__ptr;
  uchar *__ptr_00;
  ulong uVar5;
  sbyte sVar6;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  int iVar10;
  size_t __n;
  uint *__src;
  size_t __size;
  ulong uVar11;
  ulong uVar12;
  int iVar13;
  size_t sVar14;
  uint uVar15;
  bool bVar16;
  bool bVar17;
  aec_stream strm;
  char zero_pixel [4];
  uchar *local_2d8;
  aec_stream local_280;
  uint local_238 [16];
  undefined4 local_1f8;
  undefined4 local_1b8;
  
  uVar1 = param->pixels_per_block;
  iVar10 = param->pixels_per_scanline;
  uVar3 = (int)(iVar10 + uVar1 + -1) / (int)uVar1;
  uVar15 = param->options_mask;
  local_280.block_size = uVar1;
  local_280.rsi = uVar3;
  memset(local_238,0,0x204);
  uVar8 = 0;
  local_1f8 = 4;
  local_1b8 = 8;
  uVar4 = 1;
  do {
    if ((uVar4 & uVar15) != 0) {
      uVar8 = uVar8 | local_238[(int)uVar4];
    }
    uVar4 = uVar4 * 2;
  } while ((int)uVar4 < 0x81);
  local_280.flags = uVar8 | 0x40;
  local_280.avail_out = *destLen;
  uVar15 = param->bits_per_pixel;
  bVar16 = uVar15 == 0x40;
  bVar17 = uVar15 == 0x20;
  local_280.next_out = (uchar *)dest;
  if ((uVar15 == 0x40) || (__ptr = source, local_280.bits_per_sample = uVar15, uVar15 == 0x20)) {
    local_280.bits_per_sample = 8;
    __ptr = malloc(sourceLen);
    if (__ptr == (void *)0x0) {
      return -4;
    }
    uVar5 = (ulong)(uVar15 >> 3);
    uVar15 = 8;
    if (uVar5 <= sourceLen) {
      uVar9 = 0;
      do {
        uVar11 = 0;
        do {
          *(undefined1 *)((long)__ptr + uVar11 * (sourceLen / uVar5) + uVar9) =
               *(undefined1 *)((long)source + uVar11);
          uVar11 = uVar11 + 1;
        } while (uVar5 != uVar11);
        uVar9 = uVar9 + 1;
        source = (void *)((long)source + uVar5);
      } while (uVar9 < sourceLen / uVar5);
    }
  }
  __n = 4;
  if ((int)uVar15 < 0x11) {
    __n = (ulong)(8 < (int)uVar15) + 1;
  }
  sVar6 = 2;
  if ((int)uVar15 < 0x11) {
    sVar6 = 8 < (int)uVar15;
  }
  iVar13 = uVar3 * uVar1;
  __size = (ulong)(uint)(iVar13 << sVar6) *
           ((((sourceLen >> sVar6) + (long)iVar10) - 1) / (ulong)(long)iVar10);
  __ptr_00 = (uchar *)malloc(__size);
  if (__ptr_00 == (uchar *)0x0) {
    iVar10 = -4;
  }
  else {
    local_238[0] = 0;
    __src = local_238;
    if (sourceLen != 0) {
      uVar5 = (ulong)(iVar10 << sVar6);
      sVar14 = (uint)(iVar13 - iVar10 << sVar6) + uVar5;
      lVar7 = 0;
      uVar9 = 0;
      local_2d8 = __ptr_00;
      do {
        uVar11 = sourceLen - uVar9;
        if (uVar5 <= sourceLen - uVar9) {
          uVar11 = uVar5;
        }
        memcpy(__ptr_00 + lVar7,(void *)((long)__ptr + uVar9),uVar11);
        uVar9 = uVar9 + uVar11;
        puVar2 = (uint *)((long)__ptr + (uVar9 - __n));
        if ((uVar8 & 8) == 0) {
          puVar2 = __src;
        }
        __src = puVar2;
        if (sVar14 != uVar11) {
          uVar12 = 0;
          do {
            memcpy(local_2d8 + uVar12 + uVar11,__src,__n);
            uVar12 = uVar12 + __n;
          } while (uVar12 < sVar14 - uVar11);
        }
        lVar7 = lVar7 + sVar14;
        local_2d8 = local_2d8 + sVar14;
      } while (uVar9 < sourceLen);
    }
    local_280.next_in = __ptr_00;
    local_280.avail_in = __size;
    iVar13 = aec_buffer_encode(&local_280);
    *destLen = local_280.total_out;
    iVar10 = 2;
    if (iVar13 != -2) {
      iVar10 = iVar13;
    }
    free(__ptr_00);
  }
  if ((bVar17 || bVar16) && __ptr != (void *)0x0) {
    free(__ptr);
  }
  return iVar10;
}

Assistant:

int SZ_BufftoBuffCompress(void *dest, size_t *destLen,
                          const void *source, size_t sourceLen,
                          SZ_com_t *param)
{
    struct aec_stream strm;
    int status;

    strm.block_size = param->pixels_per_block;
    strm.rsi = (param->pixels_per_scanline + param->pixels_per_block - 1)
        / param->pixels_per_block;
    strm.flags = AEC_NOT_ENFORCE | convert_options(param->options_mask);
    strm.avail_out = *destLen;
    strm.next_out = dest;
    void *buf = 0;
    void *padbuf = 0;

    int interleave = param->bits_per_pixel == 32 || param->bits_per_pixel == 64;
    if (interleave) {
        strm.bits_per_sample = 8;
        buf = malloc(sourceLen);
        if (buf == NULL) {
            status = SZ_MEM_ERROR;
            goto CLEANUP;
        }
        interleave_buffer(buf, source, sourceLen, param->bits_per_pixel / 8);
    } else {
        strm.bits_per_sample = param->bits_per_pixel;
        buf = (void *)source;
    }

    int pixel_size = bits_to_bytes(strm.bits_per_sample);

    size_t scanlines = (sourceLen / pixel_size + param->pixels_per_scanline - 1)
        / param->pixels_per_scanline;
    size_t padbuf_size = strm.rsi * strm.block_size * pixel_size * scanlines;
    padbuf = malloc(padbuf_size);
    if (padbuf == NULL) {
        status = SZ_MEM_ERROR;
        goto CLEANUP;
    }

    size_t padding_size =
        (strm.rsi * strm.block_size - param->pixels_per_scanline)
        * pixel_size;

    add_padding(padbuf, buf, sourceLen,
                param->pixels_per_scanline * pixel_size,
                padding_size, pixel_size,
                strm.flags & AEC_DATA_PREPROCESS);
    strm.next_in = padbuf;
    strm.avail_in = padbuf_size;

    int aec_status = aec_buffer_encode(&strm);
    if (aec_status == AEC_STREAM_ERROR)
        status = SZ_OUTBUFF_FULL;
    else
        status = aec_status;
    *destLen = strm.total_out;

CLEANUP:
    if (padbuf)
        free(padbuf);
    if (interleave && buf)
        free(buf);
    return status;
}